

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilSupp.c
# Opt level: O1

void Abc_SuppRemove(Vec_Wrd_t *p,int *pCounts,Vec_Wec_t *pS,Vec_Wec_t *pD,int iVar,int nVars)

{
  ulong uVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  int *piVar11;
  bool bVar12;
  
  if ((iVar < 0) || (pS->nSize <= iVar)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                  ,0xd3,"int Vec_WecLevelSize(Vec_Wec_t *, int)");
  }
  if (pS->pArray[(uint)iVar].nSize != 0) {
    __assert_fail("Vec_WecLevelSize(pS, iVar) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilSupp.c"
                  ,0x1a2,
                  "void Abc_SuppRemove(Vec_Wrd_t *, int *, Vec_Wec_t *, Vec_Wec_t *, int, int)");
  }
  if (pD->nSize <= iVar) {
LAB_0049893c:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                  ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
  }
  pD->pArray[(uint)iVar].nSize = 0;
  if (0 < p->nSize) {
    uVar9 = 0;
    do {
      uVar1 = p->pArray[uVar9];
      if ((1L << ((byte)iVar & 0x3f) & uVar1) != 0) {
        iVar6 = pCounts[uVar9];
        pCounts[uVar9] = iVar6 + -1;
        if (iVar6 == 2) {
          if (0 < nVars) {
            uVar8 = 0;
            do {
              if ((uVar1 >> (uVar8 & 0x3f) & 1) != 0) {
                if ((long)pD->nSize <= (long)uVar8) goto LAB_0049893c;
                pVVar2 = pD->pArray;
                uVar5 = pVVar2[uVar8].nSize;
                uVar7 = 0;
                bVar12 = 0 < (int)uVar5;
                if (0 < (int)uVar5) {
                  bVar12 = true;
                  if (uVar9 != (uint)*pVVar2[uVar8].pArray) {
                    uVar7 = 0;
                    do {
                      if ((ulong)uVar5 - 1 == uVar7) {
                        bVar12 = false;
                        uVar7 = (ulong)uVar5;
                        goto LAB_004988bf;
                      }
                      lVar4 = uVar7 + 1;
                      uVar7 = uVar7 + 1;
                    } while (uVar9 != (uint)pVVar2[uVar8].pArray[lVar4]);
                    bVar12 = uVar7 < uVar5;
                  }
                }
LAB_004988bf:
                if ((uint)uVar7 != uVar5) {
                  if (!bVar12) {
                    __assert_fail("i < p->nSize",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                                  ,999,"int Vec_IntRemove(Vec_Int_t *, int)");
                  }
                  uVar10 = (uint)uVar7 + 1;
                  if ((int)uVar10 < (int)uVar5) {
                    piVar3 = pVVar2[uVar8].pArray;
                    piVar11 = piVar3 + uVar10;
                    do {
                      iVar6 = (int)uVar7;
                      piVar3[uVar7 & 0xffffffff] = *piVar11;
                      uVar5 = pVVar2[uVar8].nSize;
                      piVar11 = piVar11 + 1;
                      uVar7 = (ulong)(iVar6 + 1);
                    } while (iVar6 + 2 < (int)uVar5);
                  }
                  pVVar2[uVar8].nSize = uVar5 - 1;
                }
                Vec_WecPush(pS,(int)uVar8,(int)uVar9);
              }
              uVar8 = uVar8 + 1;
            } while (uVar8 != (uint)nVars);
          }
        }
        else if ((iVar6 == 3) && (0 < nVars)) {
          uVar8 = 0;
          do {
            if ((uVar1 >> (uVar8 & 0x3f) & 1) != 0) {
              Vec_WecPush(pD,(int)uVar8,(int)uVar9);
            }
            uVar8 = uVar8 + 1;
          } while ((uint)nVars != uVar8);
        }
      }
      uVar9 = uVar9 + 1;
    } while ((long)uVar9 < (long)p->nSize);
  }
  return;
}

Assistant:

void Abc_SuppRemove( Vec_Wrd_t * p, int * pCounts, Vec_Wec_t * pS, Vec_Wec_t * pD, int iVar, int nVars )
{
    word Entry; int i, v;
    assert( Vec_WecLevelSize(pS, iVar) == 0 );
    Vec_IntClear( Vec_WecEntry(pD, iVar) );
    Vec_WrdForEachEntry( p, Entry, i )
    {
        if ( ((Entry >> iVar) & 1) == 0 )
            continue;
        pCounts[i]--;
        if ( pCounts[i] == 1 )
        {
            for ( v = 0; v < nVars; v++ )
                if ( (Entry >> v) & 1 )
                {
                    Vec_IntRemove( Vec_WecEntry(pD, v), i );
                    Vec_WecPush( pS, v, i );
                }
        }
        else if ( pCounts[i] == 2 )
        {
            for ( v = 0; v < nVars; v++ )
                if ( (Entry >> v) & 1 )
                    Vec_WecPush( pD, v, i );
        }        
    }
}